

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initRandomVec(HModel *this)

{
  pointer piVar1;
  pointer pdVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  std::vector<int,_std::allocator<int>_>::resize(&this->intBreak,(long)this->numTot);
  iVar6 = this->numTot;
  if (0 < iVar6) {
    piVar1 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      piVar1[lVar9] = (int)lVar9;
      lVar9 = lVar9 + 1;
      iVar6 = this->numTot;
    } while (lVar9 < iVar6);
    if (1 < iVar6) {
      piVar1 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)iVar6;
      do {
        uVar8 = (this->random).random_mw;
        uVar5 = (this->random).random_mz;
        uVar5 = (uVar5 >> 0x10) + (uVar5 & 0xffff) * 0x9069;
        (this->random).random_mz = uVar5;
        uVar8 = (uVar8 >> 0x10) + (uVar8 & 0xffff) * 18000;
        (this->random).random_mw = uVar8;
        uVar4 = (ulong)(uVar5 * 0x10000 + uVar8 >> 1) % (uVar7 & 0xffffffff);
        iVar6 = piVar1[uVar7 - 1];
        piVar1[uVar7 - 1] = piVar1[uVar4];
        piVar1[uVar4] = iVar6;
        bVar3 = 2 < uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar3);
      iVar6 = this->numTot;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->dblXpert,(long)iVar6);
  iVar6 = this->numTot;
  if (0 < (long)iVar6) {
    pdVar2 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (this->random).random_mw;
    uVar5 = (this->random).random_mz;
    lVar9 = 0;
    do {
      uVar5 = (uVar5 >> 0x10) + (uVar5 & 0xffff) * 0x9069;
      uVar8 = (uVar8 >> 0x10) + (uVar8 & 0xffff) * 18000;
      pdVar2[lVar9] = ((double)(uVar5 * 0x10000 + uVar8) + 1.0) * 2.328306435454494e-10;
      lVar9 = lVar9 + 1;
    } while (iVar6 != lVar9);
    (this->random).random_mz = uVar5;
    (this->random).random_mw = uVar8;
  }
  return;
}

Assistant:

void HModel::initRandomVec() {
  intBreak.resize(numTot);
  for (int i = 0; i < numTot; i++)
    intBreak[i] = i;
  for (int i = numTot - 1; i >= 1; i--) {
    int j = random.intRandom() % (i + 1);
    swap(intBreak[i], intBreak[j]);
  }
  dblXpert.resize(numTot);
  for (int i = 0; i < numTot; i++)
    dblXpert[i] = random.dblRandom();
  
}